

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void pop_macro_call(c2m_ctx_t c2m_ctx)

{
  short sVar1;
  ushort uVar2;
  long lVar3;
  MIR_error_func_t p_Var4;
  uint *puVar5;
  gen_ctx *pgVar6;
  VARR_token_t *pVVar7;
  pre_ctx *ppVar8;
  macro_t pmVar9;
  VARR_macro_call_t *pVVar10;
  VARR_char *pVVar11;
  token_t *pptVar12;
  pos_t pVar13;
  char *pcVar14;
  MIR_item_t pMVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  c2m_ctx_t pcVar20;
  MIR_context_t pMVar21;
  token_t ptVar22;
  token_t ptVar23;
  macro_call_t pmVar24;
  VARR_token_arr_t *pVVar25;
  ulong *puVar26;
  void *pvVar27;
  token_arr_t pVVar28;
  token_t *pptVar29;
  token_arr_t *ppVVar30;
  macro_call_t *__ptr;
  c2m_ctx_t pcVar31;
  node_t_conflict pnVar32;
  long *plVar33;
  undefined8 *puVar34;
  MIR_context_t pMVar35;
  MIR_context_t pMVar36;
  undefined1 *puVar37;
  uint uVar38;
  token_t t;
  ulong uVar39;
  char *format;
  long extraout_RDX;
  VARR_char *pVVar40;
  c2m_ctx_t pcVar41;
  c2m_ctx_t in_RSI;
  c2m_ctx_t pcVar42;
  c2m_ctx_t pcVar43;
  c2m_ctx_t pcVar44;
  char *pcVar45;
  char **in_R8;
  token_t t_00;
  MIR_context_t pMVar46;
  c2m_ctx_t pcVar47;
  char cVar48;
  ulong uVar49;
  MIR_context_t pMVar50;
  size_t sVar51;
  c2m_ctx_t pcVar52;
  c2m_ctx_t pcVar53;
  size_t sVar54;
  c2mir_options *pcVar55;
  bool bVar56;
  bool bVar57;
  str_t sVar58;
  MIR_context_t pMStack_100;
  MIR_context_t pMStack_e8;
  MIR_context_t pMStack_e0;
  c2m_ctx_t pcStack_c8;
  uint uStack_6c;
  
  if (((c2m_ctx != (c2m_ctx_t)0x0) && (lVar3 = c2m_ctx->env[0].__jmpbuf[0], lVar3 != 0)) &&
     (pMVar36 = c2m_ctx->ctx, pMVar36 != (MIR_context_t)0x0)) {
    c2m_ctx->ctx = (MIR_context_t)((long)&pMVar36[-1].wrapper_end_addr + 7);
    pmVar24 = *(macro_call_t *)(lVar3 + -8 + (long)pMVar36 * 8);
    pmVar24->macro->ignore_p = 0;
    free_macro_call(pmVar24);
    return;
  }
  pop_macro_call_cold_1();
  pMVar36 = in_RSI->ctx;
  p_Var4 = pMVar36->error_func;
  pcVar44 = in_RSI;
  pcVar42 = c2m_ctx;
  if (p_Var4 != (MIR_error_func_t)0x0) {
    iVar17 = *(int *)p_Var4;
    iVar18 = *(int *)(in_RSI->env[0].__jmpbuf + 2);
    if (iVar18 < iVar17) {
      lVar3 = *(long *)(p_Var4 + 0x10);
      uStack_6c = 0xffffffff;
      pcVar43 = in_RSI;
      do {
        *(int *)(in_RSI->env[0].__jmpbuf + 2) = iVar18 + 1;
        ptVar22 = *(token_t *)(lVar3 + (long)iVar18 * 8);
        sVar1 = *(short *)ptVar22;
        if (sVar1 == 0x103) {
          pcVar42 = (c2m_ctx_t)pMVar36->c2mir_ctx;
          pcVar43 = (c2m_ctx_t)ptVar22->repr;
          uVar16 = find_param((VARR_token_t *)pcVar42,(char *)pcVar43);
          if ((int)uVar16 < 0) goto LAB_00190f61;
          puVar26 = (ulong *)in_RSI->env[0].__jmpbuf[1];
          if (((puVar26 == (ulong *)0x0) || (puVar26[2] == 0)) || (*puVar26 <= (ulong)uVar16)) {
LAB_001915b8:
            process_replacement_cold_18();
LAB_001915bd:
            process_replacement_cold_9();
LAB_001915c2:
            process_replacement_cold_10();
LAB_001915c7:
            process_replacement_cold_3();
            pcVar44 = pcVar43;
LAB_001915cc:
            pcVar43 = pcVar44;
            process_replacement_cold_7();
LAB_001915d1:
            process_replacement_cold_12();
LAB_001915d6:
            process_replacement_cold_2();
LAB_001915db:
            process_replacement_cold_8();
            pcVar44 = pcVar43;
            goto LAB_001915e0;
          }
          pcVar43 = *(c2m_ctx_t *)(puVar26[2] + (ulong)uVar16 * 8);
          if (-1 < (int)uStack_6c) {
            pcVar44 = (c2m_ctx_t)(ulong)uStack_6c;
            del_tokens((VARR_token_t *)in_RSI->env[0].__jmpbuf[3],uStack_6c,-1);
            pcVar42 = pcVar43;
            if (pcVar43 == (c2m_ctx_t)0x0) goto LAB_001915f9;
            pMVar21 = pcVar43->ctx;
            if (pMVar21 == (MIR_context_t)0x0) {
LAB_0019101d:
              pMVar35 = in_RSI->ctx;
            }
            else {
              pptVar29 = (token_t *)pcVar43->env[0].__jmpbuf[0];
              if (pptVar29 == (token_t *)0x0) goto LAB_00191603;
              sVar1 = *(short *)*pptVar29;
              if ((sVar1 == 0x20) || (sVar1 == 10)) {
                pcVar44 = (c2m_ctx_t)0x0;
                del_tokens((VARR_token_t *)pcVar43,0,1);
                pMVar21 = pcVar43->ctx;
                if (pMVar21 == (MIR_context_t)0x0) goto LAB_0019101d;
              }
              pMVar35 = (MIR_context_t)pcVar43->env[0].__jmpbuf[0];
              if (pMVar35 == (MIR_context_t)0x0) goto LAB_0019160d;
              sVar1 = (short)(&pMVar35->temp_data)[(long)&pMVar21[-1].wrapper_end_addr]->els_num;
              if (((sVar1 == 10) || (sVar1 == 0x20)) &&
                 (pMVar21 = (MIR_context_t)((long)&pMVar21[-1].wrapper_end_addr + 7),
                 pcVar43->ctx = pMVar21, pMVar21 == (MIR_context_t)0x0)) goto LAB_0019101d;
            }
            pgVar6 = pMVar35->gen_ctx;
            pcVar45 = (c2m_ctx->empty_str).s;
            sVar51 = (c2m_ctx->empty_str).len;
            pVar13 = *(pos_t *)&pgVar6->optimize_level;
            pnVar32 = new_node(c2m_ctx,N_STR);
            add_pos(c2m_ctx,pnVar32,pVar13);
            (pnVar32->u).s.s = pcVar45;
            (pnVar32->u).s.len = sVar51;
            pcVar14 = ((pos_t *)&pgVar6->optimize_level)->fname;
            pMVar15 = pgVar6->curr_func_item;
            sVar58 = uniq_cstr(c2m_ctx,"");
            pcVar45 = sVar58.s;
            pcVar44 = (c2m_ctx_t)0x30;
            pcVar42 = c2m_ctx;
            pcVar20 = (c2m_ctx_t)reg_malloc(c2m_ctx,0x30);
            *(undefined4 *)&pcVar20->ctx = 0x102;
            ((pos_t *)&pcVar20->options)->fname = pcVar14;
            pcVar20->env[0].__jmpbuf[0] = (long)pMVar15;
            pcVar20->env[0].__jmpbuf[3] = (long)pcVar45;
            *(undefined4 *)(pcVar20->env[0].__jmpbuf + 1) = 0;
            pcVar20->env[0].__jmpbuf[2] = (long)pnVar32;
            pVVar40 = c2m_ctx->temp_string;
            if ((pVVar40 != (VARR_char *)0x0) &&
               (pcVar31 = (c2m_ctx_t)pVVar40->varr, pcVar31 != (c2m_ctx_t)0x0)) {
              pVVar40->els_num = 0;
              cVar48 = *pcVar45;
              if (cVar48 == '\0') {
                uVar49 = 1;
                sVar51 = 0;
              }
              else {
                do {
                  pcVar45 = pcVar45 + 1;
                  pVVar40 = c2m_ctx->temp_string;
                  pcVar31 = (c2m_ctx_t)pVVar40->varr;
                  if (pcVar31 == (c2m_ctx_t)0x0) goto LAB_001915cc;
                  sVar51 = pVVar40->els_num;
                  uVar49 = sVar51 + 1;
                  if (pVVar40->size < uVar49) {
                    pcVar53 = (c2m_ctx_t)((uVar49 >> 1) + uVar49);
                    pcVar44 = pcVar53;
                    pcVar42 = pcVar31;
                    pcVar31 = (c2m_ctx_t)realloc(pcVar31,(size_t)pcVar53);
                    pVVar40->varr = (char *)pcVar31;
                    pVVar40->size = (size_t)pcVar53;
                    sVar51 = pVVar40->els_num;
                    uVar49 = sVar51 + 1;
                  }
                  pVVar40->els_num = uVar49;
                  *(char *)((long)pcVar31->env[0].__jmpbuf + (sVar51 - 0x10)) = cVar48;
                  cVar48 = *pcVar45;
                } while (cVar48 != '\0');
                pVVar40 = c2m_ctx->temp_string;
                pcVar31 = (c2m_ctx_t)pVVar40->varr;
                if (pcVar31 == (c2m_ctx_t)0x0) goto LAB_00191608;
                sVar51 = pVVar40->els_num;
                uVar49 = sVar51 + 1;
              }
              if (pVVar40->size < uVar49) {
                sVar54 = (uVar49 >> 1) + uVar49;
                pcVar42 = pcVar31;
                pcVar31 = (c2m_ctx_t)realloc(pcVar31,sVar54);
                pVVar40->varr = (char *)pcVar31;
                pVVar40->size = sVar54;
                sVar51 = pVVar40->els_num;
                uVar49 = sVar51 + 1;
              }
              pVVar40->els_num = uVar49;
              *(undefined1 *)((long)pcVar31->env[0].__jmpbuf + (sVar51 - 0x10)) = 0x22;
              if (pcVar43->ctx != (MIR_context_t)0x0) {
                pMVar21 = (MIR_context_t)0x0;
                do {
                  pptVar29 = (token_t *)pcVar43->env[0].__jmpbuf[0];
                  if (pptVar29 == (token_t *)0x0) goto LAB_001915d1;
                  ptVar22 = pptVar29[(long)pMVar21];
                  sVar1 = *(short *)ptVar22;
                  if ((sVar1 == 0x20) || (sVar1 == 10)) {
                    pVVar40 = c2m_ctx->temp_string;
                    pcVar44 = (c2m_ctx_t)pVVar40->varr;
                    if (pcVar44 == (c2m_ctx_t)0x0) goto LAB_001915db;
                    sVar51 = pVVar40->els_num;
                    uVar49 = sVar51 + 1;
                    if (pVVar40->size < uVar49) {
                      sVar54 = (uVar49 >> 1) + uVar49;
                      pcVar42 = pcVar44;
                      pcVar44 = (c2m_ctx_t)realloc(pcVar44,sVar54);
                      pVVar40->varr = (char *)pcVar44;
                      pVVar40->size = sVar54;
                      sVar51 = pVVar40->els_num;
                      uVar49 = sVar51 + 1;
                    }
                    pVVar40->els_num = uVar49;
                    *(undefined1 *)((long)pcVar44->env[0].__jmpbuf + (sVar51 - 0x10)) = 0x20;
                  }
                  else {
                    pcVar45 = ptVar22->repr;
                    cVar48 = *pcVar45;
                    if (cVar48 != '\0') {
                      pMVar35 = (MIR_context_t)((long)&pMVar21->gen_ctx + 1);
                      do {
                        uVar16 = 0;
                        if (pcVar43->ctx != pMVar35) {
                          if ((pcVar43->ctx <= pMVar35) ||
                             (pptVar29 = (token_t *)pcVar43->env[0].__jmpbuf[0],
                             pptVar29 == (token_t *)0x0)) goto LAB_001915bd;
                          uVar16 = (uint)*pptVar29[(long)((long)&pMVar21->gen_ctx + 1)]->repr;
                        }
                        if (cVar48 == '\"') {
LAB_001912ac:
                          pVVar40 = c2m_ctx->temp_string;
                          pcVar44 = (c2m_ctx_t)pVVar40->varr;
                          if (pcVar44 == (c2m_ctx_t)0x0) goto LAB_001915c2;
                          sVar51 = pVVar40->els_num;
                          uVar49 = sVar51 + 1;
                          if (pVVar40->size < uVar49) {
                            sVar54 = (uVar49 >> 1) + uVar49;
                            pcVar42 = pcVar44;
                            pcVar44 = (c2m_ctx_t)realloc(pcVar44,sVar54);
                            pVVar40->varr = (char *)pcVar44;
                            pVVar40->size = sVar54;
                            sVar51 = pVVar40->els_num;
                            uVar49 = sVar51 + 1;
                          }
                          pVVar40->els_num = uVar49;
                          *(undefined1 *)((long)pcVar44->env[0].__jmpbuf + (sVar51 - 0x10)) = 0x5c;
                          cVar48 = *pcVar45;
                        }
                        else if (cVar48 == '\\') {
                          cVar48 = '\\';
                          if (((0x37 < uVar16 - 0x3f) ||
                              ((0xa880cc20000001U >> ((ulong)(uVar16 - 0x3f) & 0x3f) & 1) == 0)) &&
                             ((uVar16 & 0xffffffdf) != 0x58 && (uVar16 & 0xfffffff8) != 0x30))
                          goto LAB_001912ac;
                        }
                        pVVar40 = c2m_ctx->temp_string;
                        pcVar44 = (c2m_ctx_t)pVVar40->varr;
                        if (pcVar44 == (c2m_ctx_t)0x0) {
                          process_replacement_cold_11();
                          goto LAB_001915b8;
                        }
                        sVar51 = pVVar40->els_num;
                        uVar49 = sVar51 + 1;
                        if (pVVar40->size < uVar49) {
                          sVar54 = (uVar49 >> 1) + uVar49;
                          pcVar42 = pcVar44;
                          pcVar44 = (c2m_ctx_t)realloc(pcVar44,sVar54);
                          pVVar40->varr = (char *)pcVar44;
                          pVVar40->size = sVar54;
                          sVar51 = pVVar40->els_num;
                          uVar49 = sVar51 + 1;
                        }
                        pVVar40->els_num = uVar49;
                        *(char *)((long)pcVar44->env[0].__jmpbuf + (sVar51 - 0x10)) = cVar48;
                        cVar48 = pcVar45[1];
                        pcVar45 = pcVar45 + 1;
                      } while (cVar48 != '\0');
                    }
                  }
                  pMVar21 = (MIR_context_t)((long)&pMVar21->gen_ctx + 1);
                } while (pMVar21 < pcVar43->ctx);
              }
              pVVar40 = c2m_ctx->temp_string;
              pcVar44 = (c2m_ctx_t)pVVar40->varr;
              if (pcVar44 != (c2m_ctx_t)0x0) {
                sVar51 = pVVar40->els_num;
                uVar49 = sVar51 + 1;
                if (pVVar40->size < uVar49) {
                  pcVar31 = (c2m_ctx_t)((uVar49 >> 1) + uVar49);
                  pcVar43 = pcVar31;
                  pcVar42 = pcVar44;
                  pcVar44 = (c2m_ctx_t)realloc(pcVar44,(size_t)pcVar31);
                  pVVar40->varr = (char *)pcVar44;
                  pVVar40->size = (size_t)pcVar31;
                  sVar51 = pVVar40->els_num;
                  uVar49 = sVar51 + 1;
                }
                pVVar40->els_num = uVar49;
                *(undefined1 *)((long)pcVar44->env[0].__jmpbuf + (sVar51 - 0x10)) = 0x22;
                pVVar40 = c2m_ctx->temp_string;
                pcVar44 = (c2m_ctx_t)pVVar40->varr;
                if (pcVar44 != (c2m_ctx_t)0x0) {
                  sVar51 = pVVar40->els_num;
                  uVar49 = sVar51 + 1;
                  if (pVVar40->size < uVar49) {
                    pcVar31 = (c2m_ctx_t)((uVar49 >> 1) + uVar49);
                    pcVar43 = pcVar31;
                    pcVar42 = pcVar44;
                    pcVar44 = (c2m_ctx_t)realloc(pcVar44,(size_t)pcVar31);
                    pVVar40->varr = (char *)pcVar44;
                    pVVar40->size = (size_t)pcVar31;
                    sVar51 = pVVar40->els_num;
                    uVar49 = sVar51 + 1;
                  }
                  pVVar40->els_num = uVar49;
                  *(undefined1 *)((long)pcVar44->env[0].__jmpbuf + (sVar51 - 0x10)) = 0;
                  if (c2m_ctx->temp_string != (VARR_char *)0x0) {
                    sVar58 = uniq_cstr(c2m_ctx,c2m_ctx->temp_string->varr);
                    pcVar20->env[0].__jmpbuf[3] = (long)sVar58.s;
                    set_string_val(c2m_ctx,(token_t)pcVar20,c2m_ctx->temp_string,0x20);
                    goto LAB_00190f77;
                  }
                  goto LAB_001915fe;
                }
                goto LAB_001915f4;
              }
              goto LAB_001915ef;
            }
            goto LAB_001915e5;
          }
          iVar18 = *(int *)(in_RSI->env[0].__jmpbuf + 2);
          lVar19 = (long)iVar18;
          if (((lVar19 < 2) ||
              ((sVar1 = **(short **)(lVar3 + -0x10 + lVar19 * 8), sVar1 != 0x142 &&
               (((iVar18 == 2 || (sVar1 != 0x20)) ||
                (**(short **)(lVar3 + -0x18 + lVar19 * 8) != 0x142)))))) &&
             (((iVar17 <= iVar18 || (**(short **)(lVar3 + lVar19 * 8) != 0x142)) &&
              ((iVar17 <= iVar18 + 1 ||
               ((**(short **)(lVar3 + (long)(iVar18 + 1) * 8) != 0x142 ||
                (**(short **)(lVar3 + lVar19 * 8) != 0x20)))))))) {
            pcVar45 = (ptVar22->pos).fname;
            iVar17 = (ptVar22->pos).lno;
            iVar18 = (ptVar22->pos).ln_pos;
            ptVar23 = (token_t)reg_malloc(c2m_ctx,0x30);
            *(undefined4 *)ptVar23 = 0x144;
            (ptVar23->pos).fname = pcVar45;
            (ptVar23->pos).lno = iVar17;
            (ptVar23->pos).ln_pos = iVar18;
            ptVar23->repr = "";
            ptVar23->node_code = N_IGNORE;
            ptVar23->node = (node_t_conflict)0x0;
            unget_next_pptoken((c2m_ctx_t)c2m_ctx->buffered_tokens,ptVar23);
            copy_and_push_back(c2m_ctx,(VARR_token_t *)pcVar43,*(pos_t *)&in_RSI->options);
            pcVar45 = (ptVar22->pos).fname;
            iVar17 = (ptVar22->pos).lno;
            iVar18 = (ptVar22->pos).ln_pos;
            ptVar22 = (token_t)reg_malloc(c2m_ctx,0x30);
            *(undefined4 *)ptVar22 = 0x143;
            (ptVar22->pos).fname = pcVar45;
            (ptVar22->pos).lno = iVar17;
            (ptVar22->pos).ln_pos = iVar18;
            ptVar22->repr = "";
            ptVar22->node_code = N_IGNORE;
            ptVar22->node = (node_t_conflict)0x0;
            unget_next_pptoken((c2m_ctx_t)c2m_ctx->buffered_tokens,ptVar22);
            return;
          }
          if (pcVar43 == (c2m_ctx_t)0x0) goto LAB_001915c7;
          if (pcVar43->ctx == (MIR_context_t)0x1) {
            pptVar29 = (token_t *)pcVar43->env[0].__jmpbuf[0];
            if (pptVar29 != (token_t *)0x0) {
              sVar1 = *(short *)*pptVar29;
              if ((sVar1 == 0x20) || (sVar1 == 10)) goto LAB_00190f19;
              goto LAB_00190ee0;
            }
            goto LAB_001915d6;
          }
          if (pcVar43->ctx == (MIR_context_t)0x0) {
LAB_00190f19:
            pcVar45 = (ptVar22->pos).fname;
            lVar19 = *(long *)&(ptVar22->pos).lno;
            pcVar20 = (c2m_ctx_t)reg_malloc(c2m_ctx,0x30);
            *(undefined4 *)&pcVar20->ctx = 0x141;
            ((pos_t *)&pcVar20->options)->fname = pcVar45;
            pcVar20->env[0].__jmpbuf[0] = lVar19;
            pcVar20->env[0].__jmpbuf[3] = (long)"";
            *(undefined4 *)(pcVar20->env[0].__jmpbuf + 1) = 0;
            pcVar20->env[0].__jmpbuf[2] = 0;
            goto LAB_00190f77;
          }
LAB_00190ee0:
          pcVar42 = (c2m_ctx_t)in_RSI->env[0].__jmpbuf[3];
          add_tokens((VARR_token_t *)pcVar42,(VARR_token_t *)pcVar43);
        }
        else {
          if (sVar1 != 0x20) {
            if (sVar1 == 0x23) {
              puVar5 = (uint *)in_RSI->env[0].__jmpbuf[3];
              if (puVar5 == (uint *)0x0) goto LAB_001915ea;
              uStack_6c = *puVar5;
            }
            else {
              uStack_6c = 0xffffffff;
            }
          }
LAB_00190f61:
          pcVar20 = (c2m_ctx_t)copy_token(c2m_ctx,ptVar22,*(pos_t *)&in_RSI->options);
LAB_00190f77:
          pcVar42 = (c2m_ctx_t)in_RSI->env[0].__jmpbuf[3];
          add_token((VARR_token_t *)pcVar42,(token_t)pcVar20);
          pcVar43 = pcVar20;
        }
        iVar18 = *(int *)(in_RSI->env[0].__jmpbuf + 2);
      } while (iVar18 < iVar17);
    }
    ptVar22 = get_next_pptoken_1(c2m_ctx,0);
    unget_next_pptoken((c2m_ctx_t)c2m_ctx->buffered_tokens,ptVar22);
    pcVar45 = (ptVar22->pos).fname;
    iVar17 = (ptVar22->pos).lno;
    iVar18 = (ptVar22->pos).ln_pos;
    ptVar22 = (token_t)reg_malloc(c2m_ctx,0x30);
    *(undefined4 *)ptVar22 = 0x145;
    (ptVar22->pos).fname = pcVar45;
    (ptVar22->pos).lno = iVar17;
    (ptVar22->pos).ln_pos = iVar18;
    ptVar22->repr = "";
    ptVar22->node_code = N_IGNORE;
    ptVar22->node = (node_t_conflict)0x0;
    unget_next_pptoken((c2m_ctx_t)c2m_ctx->buffered_tokens,ptVar22);
    pVVar7 = (VARR_token_t *)in_RSI->env[0].__jmpbuf[3];
    do_concat(c2m_ctx,pVVar7);
    push_back(c2m_ctx,pVVar7);
    pMVar36->func_redef_permission_p = 1;
    return;
  }
LAB_001915e0:
  process_replacement_cold_19();
LAB_001915e5:
  process_replacement_cold_16();
  pcVar43 = pcVar44;
LAB_001915ea:
  process_replacement_cold_1();
LAB_001915ef:
  process_replacement_cold_15();
LAB_001915f4:
  process_replacement_cold_14();
  pcVar44 = pcVar43;
LAB_001915f9:
  pcVar43 = pcVar44;
  process_replacement_cold_17();
LAB_001915fe:
  process_replacement_cold_13();
  pcVar44 = pcVar43;
LAB_00191603:
  process_replacement_cold_5();
LAB_00191608:
  process_replacement_cold_6();
  pcVar43 = pcVar42;
LAB_0019160d:
  process_replacement_cold_4();
  ppVar8 = pcVar43->pre_ctx;
  while( true ) {
    ptVar22 = get_next_pptoken_1(pcVar43,0);
    if ((short)*(uint *)ptVar22 != 0x145) break;
    pop_macro_call((c2m_ctx_t)pcVar43->pre_ctx->macro_call_stack);
  }
  uVar16 = *(uint *)ptVar22 & 0xffff;
  pMVar36 = (MIR_context_t)(ulong)uVar16;
  if ((uVar16 == 10) || (uVar16 == 0x20)) {
    ptVar23 = get_next_pptoken_1(pcVar43,0);
    pMVar36 = (MIR_context_t)(ulong)*(ushort *)ptVar23;
    t_00 = ptVar22;
  }
  else {
    t_00 = (token_t)0x0;
    ptVar23 = ptVar22;
  }
  if ((int)pMVar36 != 0x28) {
    unget_next_pptoken((c2m_ctx_t)pcVar43->buffered_tokens,ptVar23);
    if (t_00 != (token_t)0x0) {
      unget_next_pptoken((c2m_ctx_t)pcVar43->buffered_tokens,t_00);
    }
    out_token(pcVar43,t);
    return;
  }
  pcVar42 = (c2m_ctx_t)(t->pos).fname;
  pmVar24 = new_macro_call((macro_t)pcVar44,t->pos);
  pmVar9 = pmVar24->macro;
  pcVar44 = (c2m_ctx_t)&DAT_00000018;
  pVVar25 = (VARR_token_arr_t *)malloc(0x18);
  if (pVVar25 == (VARR_token_arr_t *)0x0) {
LAB_00191caf:
    mir_varr_error((char *)pcVar44);
  }
  pVVar25->els_num = 0;
  pVVar25->size = 0x10;
  pcStack_c8 = (c2m_ctx_t)malloc(0x80);
  pcVar44 = (c2m_ctx_t)&DAT_00000018;
  pVVar25->varr = (token_arr_t *)pcStack_c8;
  puVar26 = (ulong *)malloc(0x18);
  if (puVar26 == (ulong *)0x0) goto LAB_00191caf;
  pcVar44 = (c2m_ctx_t)0x80;
  *puVar26 = 0;
  puVar26[1] = 0x10;
  pvVar27 = malloc(0x80);
  puVar26[2] = (ulong)pvVar27;
  pVVar7 = pmVar9->params;
  if (pVVar7 == (VARR_token_t *)0x0) {
LAB_00191cc3:
    try_param_macro_call_cold_16();
LAB_00191cc8:
    try_param_macro_call_cold_14();
    goto LAB_00191ccd;
  }
  pMVar21 = (MIR_context_t)pVVar7->els_num;
  iVar17 = 0;
  bVar56 = false;
  if (pMVar21 != (MIR_context_t)0x1) {
LAB_00191751:
    pMVar46 = (MIR_context_t)0x10;
    bVar57 = false;
    pMStack_e8 = (MIR_context_t)0x0;
    pMStack_e0 = (MIR_context_t)0x0;
    pMVar35 = (MIR_context_t)((long)&pMVar21[-1].wrapper_end_addr + 7);
    do {
      pcVar42 = (c2m_ctx_t)0x0;
      pcVar44 = pcVar43;
      pcVar20 = (c2m_ctx_t)get_next_pptoken_1(pcVar43,0);
      uVar2 = *(ushort *)&pcVar20->ctx;
      if (uVar2 == 0x145) {
        pcVar42 = (c2m_ctx_t)0x0;
        pcVar20 = (c2m_ctx_t)get_next_pptoken_1(pcVar43,0);
        pcVar44 = (c2m_ctx_t)pcVar43->pre_ctx->macro_call_stack;
        pop_macro_call(pcVar44);
        uVar2 = *(ushort *)&pcVar20->ctx;
      }
      uVar16 = (uint)uVar2;
      uVar38 = uVar16 * 0x10000 + 0xfec30000 >> 0x10;
      if (((uVar38 < 0xb) && (pcVar42 = (c2m_ctx_t)0x5c1, (0x5c1U >> (uVar38 & 0x1f) & 1) != 0)) ||
         (pMVar36 = (MIR_context_t)(ulong)CONCAT31((int3)(uVar16 * 0x10000 >> 8),uVar16 == 0x23),
         (bool)(bVar57 & uVar16 == 0x23))) {
LAB_001919f1:
        if (uVar16 != 0x29) {
          in_R8 = (char **)pmVar9->id->repr;
          error(pcVar43,0x1c19de,(char *)pcVar20->options,pcVar20->env[0].__jmpbuf[0]);
          pcVar44 = (c2m_ctx_t)pcVar43->buffered_tokens;
          pcVar42 = pcVar20;
          unget_next_pptoken(pcVar44,(token_t)pcVar20);
        }
        pMVar36 = pMStack_e8;
        if (pcStack_c8 == (c2m_ctx_t)0x0) goto LAB_00191cc8;
        pMVar35 = (MIR_context_t)((long)&pMStack_e8->gen_ctx + 1);
        if (pMVar46 < pMVar35) {
          pMVar46 = (MIR_context_t)((long)&pMVar35->gen_ctx + ((ulong)pMVar35 >> 1));
          pcVar42 = (c2m_ctx_t)((long)pMVar46 * 8);
          pcVar44 = pcStack_c8;
          pcStack_c8 = (c2m_ctx_t)realloc(pcStack_c8,(size_t)pcVar42);
          pVVar25->varr = (token_arr_t *)pcStack_c8;
          pVVar25->size = (size_t)pMVar46;
          pMVar35 = (MIR_context_t)((long)&((MIR_context_t)pVVar25->els_num)->gen_ctx + 1);
          pMVar36 = (MIR_context_t)pVVar25->els_num;
        }
        pVVar25->els_num = (size_t)pMVar35;
        pcStack_c8->env[0].__jmpbuf[(long)((long)&pMVar36[-1].wrapper_end_addr + 6)] = (long)puVar26
        ;
        if ((pMVar21 == (MIR_context_t)0x0) && (pMVar35 == (MIR_context_t)0x1)) {
          if (pVVar25->varr == (token_arr_t *)0x0) goto LAB_00191cdc;
          pcVar31 = (c2m_ctx_t)*pVVar25->varr;
          if (pcVar31 == (c2m_ctx_t)0x0) goto LAB_00191ce1;
          if (pcVar31->ctx == (MIR_context_t)0x0) {
            pcVar44 = (c2m_ctx_t)pcVar31->env[0].__jmpbuf[0];
            pVVar25->els_num = 0;
            if (pcVar44 == (c2m_ctx_t)0x0) goto LAB_00191cfa;
LAB_00191c30:
            free(pcVar44);
            free(pcVar31);
            pcVar44 = pcVar31;
            goto LAB_00191c3d;
          }
          if (pcVar31->ctx == (MIR_context_t)0x1) {
            pcVar44 = (c2m_ctx_t)pcVar31->env[0].__jmpbuf[0];
            if (pcVar44 == (c2m_ctx_t)0x0) goto LAB_00191cf5;
            if (*(short *)&pcVar44->ctx->gen_ctx == 0x20) {
              pVVar25->els_num = 0;
              goto LAB_00191c30;
            }
          }
        }
        if (pMVar35 <= pMVar21) {
          if (pMVar21 <= pMVar35) goto LAB_00191c3d;
          pMStack_100 = (MIR_context_t)0x1c1a1d;
          goto LAB_00191b75;
        }
        ppVVar30 = pVVar25->varr;
        if (ppVVar30 == (token_arr_t *)0x0) goto LAB_00191ce6;
        pVVar28 = ppVVar30[(long)pMVar21];
        if (pVVar28 == (token_arr_t)0x0) goto LAB_00191ceb;
        if (pVVar28->els_num != 0) {
          if (pVVar28->varr == (token_t *)0x0) goto LAB_00191cf0;
          pcVar20 = (c2m_ctx_t)*pVVar28->varr;
        }
        pMStack_100 = (MIR_context_t)0x1c19fa;
        goto LAB_00191b23;
      }
      if (iVar17 == 0) {
        if (uVar16 == 0x29) goto LAB_001919f1;
        if ((bVar56) || (uVar16 != 0x2c)) goto LAB_001917fe;
        if (pcStack_c8 == (c2m_ctx_t)0x0) goto LAB_00191cd2;
        pMVar50 = (MIR_context_t)((long)&pMStack_e0->gen_ctx + 1);
        pMVar36 = pMStack_e0;
        pMStack_e0 = pMVar50;
        if (pMVar46 < pMVar50) {
          pMVar46 = (MIR_context_t)((long)&pMVar50->gen_ctx + ((ulong)pMVar50 >> 1));
          pcVar42 = (c2m_ctx_t)((long)pMVar46 * 8);
          pcStack_c8 = (c2m_ctx_t)realloc(pcStack_c8,(size_t)pcVar42);
          pVVar25->varr = (token_arr_t *)pcStack_c8;
          pVVar25->size = (size_t)pMVar46;
          pMVar36 = (MIR_context_t)pVVar25->els_num;
          pMStack_e0 = (MIR_context_t)((long)&pMVar36->gen_ctx + 1);
        }
        pcVar44 = (c2m_ctx_t)&DAT_00000018;
        pVVar25->els_num = (size_t)pMStack_e0;
        pcStack_c8->env[0].__jmpbuf[(long)((long)&pMVar36[-1].wrapper_end_addr + 6)] = (long)puVar26
        ;
        puVar26 = (ulong *)malloc(0x18);
        if (puVar26 == (ulong *)0x0) goto LAB_00191caf;
        pcVar44 = (c2m_ctx_t)0x80;
        *puVar26 = 0;
        puVar26[1] = 0x10;
        pvVar27 = malloc(0x80);
        puVar26[2] = (ulong)pvVar27;
        iVar17 = 0;
        if (pMStack_e0 == pMVar35) {
          pVVar7 = pmVar9->params;
          if (((pVVar7 == (VARR_token_t *)0x0) ||
              (pMVar36 = (MIR_context_t)pVVar7->varr, pMVar36 == (MIR_context_t)0x0)) ||
             ((MIR_context_t)pVVar7->els_num <= pMVar35)) goto LAB_00191cbe;
          iVar18 = strcmp(*(char **)(*(long *)((long)pMVar36 + (long)pMVar21 * 8 + -8) + 0x28),"..."
                         );
          bVar56 = iVar18 == 0;
          pMStack_e0 = pMVar35;
          pMStack_e8 = pMVar35;
        }
        else {
          bVar56 = false;
          pMStack_e8 = pMStack_e0;
        }
      }
      else {
LAB_001917fe:
        pvVar27 = (void *)puVar26[2];
        if (pvVar27 == (void *)0x0) goto LAB_00191cb9;
        uVar39 = *puVar26;
        uVar49 = uVar39 + 1;
        if (puVar26[1] < uVar49) {
          uVar49 = (uVar49 >> 1) + uVar49;
          pvVar27 = realloc(pvVar27,uVar49 * 8);
          puVar26[2] = (ulong)pvVar27;
          puVar26[1] = uVar49;
          uVar39 = *puVar26;
          uVar49 = uVar39 + 1;
        }
        *puVar26 = uVar49;
        *(c2m_ctx_t *)((long)pvVar27 + uVar39 * 8) = pcVar20;
        if (*(short *)&pcVar20->ctx == 0x28) {
          iVar17 = iVar17 + 1;
        }
        else if (*(short *)&pcVar20->ctx == 0x29) {
          iVar17 = iVar17 + -1;
        }
      }
      bVar57 = *(short *)&pcVar20->ctx == 10;
    } while( true );
  }
  if (pVVar7->varr != (token_t *)0x0) {
    bVar56 = *(short *)*pVVar7->varr == 0x10f;
    goto LAB_00191751;
  }
  goto LAB_00191cd7;
LAB_00191b75:
  pMVar50 = (MIR_context_t)((long)&pMVar35->gen_ctx + 1);
  pcVar44 = (c2m_ctx_t)&DAT_00000018;
  pVVar28 = (token_arr_t)malloc(0x18);
  if (pVVar28 != (token_arr_t)0x0) {
    pcVar44 = (c2m_ctx_t)0x80;
    pVVar28->els_num = 0;
    pVVar28->size = 0x10;
    pptVar29 = (token_t *)malloc(0x80);
    pVVar28->varr = pptVar29;
    ppVVar30 = pVVar25->varr;
    if (ppVVar30 != (token_arr_t *)0x0) goto code_r0x00191bb5;
    try_param_macro_call_cold_6();
LAB_00191cb9:
    try_param_macro_call_cold_1();
LAB_00191cbe:
    try_param_macro_call_cold_2();
    goto LAB_00191cc3;
  }
  goto LAB_00191caf;
code_r0x00191bb5:
  pMVar36 = pMVar35;
  if (pMVar46 <= pMVar35) {
    pMVar46 = (MIR_context_t)((long)&pMVar50->gen_ctx + ((ulong)pMVar50 >> 1));
    pcVar42 = (c2m_ctx_t)((long)pMVar46 * 8);
    ppVVar30 = (token_arr_t *)realloc(ppVVar30,(size_t)pcVar42);
    pVVar25->varr = ppVVar30;
    pVVar25->size = (size_t)pMVar46;
  }
  pVVar25->els_num = (size_t)pMVar50;
  ppVVar30[(long)pMVar35] = pVVar28;
  pMVar35 = pMVar50;
  if (pMVar21 <= pMVar50) goto LAB_00191bf5;
  goto LAB_00191b75;
  while( true ) {
    pcVar52 = (c2m_ctx_t)((long)&pcVar52[-1].gen_ctx + 7);
    pcVar53 = (c2m_ctx_t)(((__jmp_buf_tag *)pcVar53)->__jmpbuf + 1);
    if (pcVar20 == pcVar52) break;
LAB_00191dfe:
    pcVar43 = (c2m_ctx_t)((__jmp_buf_tag *)pcVar53)->__jmpbuf[0];
    if (*(int *)(pcVar43->env[0].__jmpbuf + 1) == 0x19) {
      pVVar40 = pcVar44->symbol_text;
      if ((pVVar40 == (VARR_char *)0x0) ||
         (pcVar31 = (c2m_ctx_t)pVVar40->varr, pcVar31 == (c2m_ctx_t)0x0)) goto LAB_00192256;
      pVVar40->els_num = 0;
      pVVar11 = pcVar44->temp_string;
      if ((pVVar11 == (VARR_char *)0x0) || (pVVar11->varr == (char *)0x0)) goto LAB_0019225b;
      pVVar11->els_num = 0;
      pcVar43 = (c2m_ctx_t)pVVar40->els_num;
      puVar37 = (undefined1 *)((long)&pcVar43->ctx + 1);
      if ((undefined1 *)pVVar40->size < puVar37) {
        pcVar20 = pcVar31;
        pcVar31 = (c2m_ctx_t)realloc(pcVar31,(size_t)(puVar37 + ((ulong)puVar37 >> 1)));
        pVVar40->varr = (char *)pcVar31;
        pVVar40->size = (size_t)(puVar37 + ((ulong)puVar37 >> 1));
        pcVar43 = (c2m_ctx_t)pVVar40->els_num;
        puVar37 = (undefined1 *)((long)&pcVar43->ctx + 1);
      }
      pVVar40->els_num = (size_t)puVar37;
      *(undefined1 *)((long)pcVar43->env[0].__saved_mask.__val + (long)(pcVar31->env + -1) + 0x60) =
           0x3c;
      if (pcVar47 < (c2m_ctx_t)((long)pcVar41 - (long)pcVar52)) goto LAB_00191f68;
      goto LAB_0019205a;
    }
  }
LAB_00191e17:
  if (pcVar31 != (c2m_ctx_t)0x0) goto LAB_00191e1c;
  goto LAB_00191e37;
LAB_00191f68:
  do {
    pptVar12 = (token_t *)pcVar42->env[0].__jmpbuf[0];
    if ((pptVar12 == (token_t *)0x0) || ((c2m_ctx_t)pcVar42->ctx <= pcVar47)) {
LAB_0019223d:
      get_header_name_cold_9();
      goto LAB_00192242;
    }
    pcVar45 = pptVar12[(long)pcVar47]->repr;
    cVar48 = *pcVar45;
    while (cVar48 != '\0') {
      pVVar40 = pcVar44->symbol_text;
      pcVar31 = (c2m_ctx_t)pVVar40->varr;
      if (pcVar31 == (c2m_ctx_t)0x0) {
LAB_00192238:
        get_header_name_cold_2();
        goto LAB_0019223d;
      }
      sVar51 = pVVar40->els_num;
      uVar49 = sVar51 + 1;
      if (pVVar40->size < uVar49) {
        pcVar53 = (c2m_ctx_t)((uVar49 >> 1) + uVar49);
        pcVar43 = pcVar53;
        pcVar20 = pcVar31;
        pcVar31 = (c2m_ctx_t)realloc(pcVar31,(size_t)pcVar53);
        pVVar40->varr = (char *)pcVar31;
        pVVar40->size = (size_t)pcVar53;
        sVar51 = pVVar40->els_num;
        uVar49 = sVar51 + 1;
      }
      pVVar40->els_num = uVar49;
      *(char *)((long)pcVar31->env[0].__jmpbuf + (sVar51 - 0x10)) = cVar48;
      pVVar40 = pcVar44->temp_string;
      pcVar31 = (c2m_ctx_t)pVVar40->varr;
      if (pcVar31 == (c2m_ctx_t)0x0) {
        get_header_name_cold_1();
        goto LAB_00192238;
      }
      sVar51 = pVVar40->els_num;
      cVar48 = *pcVar45;
      uVar49 = sVar51 + 1;
      if (pVVar40->size < uVar49) {
        pcVar53 = (c2m_ctx_t)((uVar49 >> 1) + uVar49);
        pcVar43 = pcVar53;
        pcVar20 = pcVar31;
        pcVar31 = (c2m_ctx_t)realloc(pcVar31,(size_t)pcVar53);
        pVVar40->varr = (char *)pcVar31;
        pVVar40->size = (size_t)pcVar53;
        sVar51 = pVVar40->els_num;
        uVar49 = sVar51 + 1;
      }
      pVVar40->els_num = uVar49;
      *(char *)((long)pcVar31->env[0].__jmpbuf + (sVar51 - 0x10)) = cVar48;
      cVar48 = pcVar45[1];
      pcVar45 = pcVar45 + 1;
    }
    pcVar47 = (c2m_ctx_t)((long)&pcVar47->ctx + 1);
  } while ((c2m_ctx_t)((long)pcVar41 - (long)pcVar52) != pcVar47);
LAB_0019205a:
  pVVar40 = pcVar44->symbol_text;
  pcVar31 = (c2m_ctx_t)pVVar40->varr;
  if (pcVar31 == (c2m_ctx_t)0x0) goto LAB_00192265;
  sVar51 = pVVar40->els_num;
  uVar49 = sVar51 + 1;
  if (pVVar40->size < uVar49) {
    pcVar53 = (c2m_ctx_t)((uVar49 >> 1) + uVar49);
    pcVar43 = pcVar53;
    pcVar20 = pcVar31;
    pcVar31 = (c2m_ctx_t)realloc(pcVar31,(size_t)pcVar53);
    pVVar40->varr = (char *)pcVar31;
    pVVar40->size = (size_t)pcVar53;
    sVar51 = pVVar40->els_num;
    uVar49 = sVar51 + 1;
  }
  pVVar40->els_num = uVar49;
  *(undefined1 *)((long)pcVar31->env[0].__jmpbuf + (sVar51 - 0x10)) = 0x3e;
  pVVar40 = pcVar44->symbol_text;
  pcVar31 = (c2m_ctx_t)pVVar40->varr;
  if (pcVar31 == (c2m_ctx_t)0x0) goto LAB_0019226a;
  sVar51 = pVVar40->els_num;
  uVar49 = sVar51 + 1;
  if (pVVar40->size < uVar49) {
    pcVar53 = (c2m_ctx_t)((uVar49 >> 1) + uVar49);
    pcVar43 = pcVar53;
    pcVar20 = pcVar31;
    pcVar31 = (c2m_ctx_t)realloc(pcVar31,(size_t)pcVar53);
    pVVar40->varr = (char *)pcVar31;
    pVVar40->size = (size_t)pcVar53;
    sVar51 = pVVar40->els_num;
    uVar49 = sVar51 + 1;
  }
  pVVar40->els_num = uVar49;
  *(undefined1 *)((long)pcVar31->env[0].__jmpbuf + (sVar51 - 0x10)) = 0;
  pVVar40 = pcVar44->temp_string;
  pcVar45 = pVVar40->varr;
  if (pcVar45 == (char *)0x0) goto LAB_0019226f;
  sVar51 = pVVar40->els_num;
  uVar49 = sVar51 + 1;
  if (pVVar40->size < uVar49) {
    sVar54 = (uVar49 >> 1) + uVar49;
    pcVar45 = (char *)realloc(pcVar45,sVar54);
    pVVar40->varr = pcVar45;
    pVVar40->size = sVar54;
    sVar51 = pVVar40->els_num;
    uVar49 = sVar51 + 1;
  }
  pVVar40->els_num = uVar49;
  pcVar45[sVar51] = '\0';
  pcVar43 = (c2m_ctx_t)((ulong)pcVar41 & 0xffffffff);
  pcVar20 = pcVar42;
  del_tokens((VARR_token_t *)pcVar42,(int)pcVar41,-(int)pcVar52);
  if (pcVar44->symbol_text != (VARR_char *)0x0) {
    if (pcVar44->temp_string == (VARR_char *)0x0) goto LAB_00192279;
    pcVar45 = pcVar44->symbol_text->varr;
    sVar58 = uniq_cstr(pcVar44,pcVar44->temp_string->varr);
    pnVar32 = new_node(pcVar44,N_STR);
    add_pos(pcVar44,pnVar32,pVar13);
    (pnVar32->u).s = sVar58;
    sVar58 = uniq_cstr(pcVar44,pcVar45);
    pcVar43 = (c2m_ctx_t)0x30;
    pcVar20 = pcVar44;
    ptVar22 = (token_t)reg_malloc(pcVar44,0x30);
    *(undefined4 *)ptVar22 = 0x13e;
    (ptVar22->pos).fname = (char *)pcVar55;
    *(token_t **)&(ptVar22->pos).lno = pptVar29;
    ptVar22->repr = sVar58.s;
    ptVar22->node_code = N_IGNORE;
    ptVar22->node = pnVar32;
    pptVar29 = (token_t *)pcVar42->env[0].__jmpbuf[0];
    if ((pptVar29 != (token_t *)0x0) && (pcVar31 = (c2m_ctx_t)pcVar42->ctx, pcVar41 < pcVar31)) {
      pptVar29[(long)pcVar41] = ptVar22;
      goto LAB_00191e1c;
    }
    goto LAB_00192260;
  }
  goto LAB_00192274;
  while( true ) {
    free(pcVar44);
    free(pcVar42);
    pcVar44 = pcVar42;
    pMVar35 = pMVar36;
    if (pMVar36 <= pMVar21) break;
LAB_00191b23:
    pMVar36 = (MIR_context_t)((long)&pMVar35[-1].wrapper_end_addr + 7);
    pVVar25->els_num = (size_t)pMVar36;
    pcVar42 = (c2m_ctx_t)ppVVar30[(long)((long)&pMVar35[-1].wrapper_end_addr + 7)];
    if ((pcVar42 == (c2m_ctx_t)0x0) ||
       (pcVar44 = (c2m_ctx_t)pcVar42->env[0].__jmpbuf[0], pcVar44 == (c2m_ctx_t)0x0)) {
      try_param_macro_call_cold_9();
      goto LAB_00191caf;
    }
  }
LAB_00191bf5:
  pcVar42 = (c2m_ctx_t)((pos_t *)&pcVar20->options)->fname;
  in_R8 = (char **)pmVar9->id->repr;
  error(pcVar43,pMStack_100,(char *)pcVar42,pcVar20->env[0].__jmpbuf[0]);
  pMVar36 = pMStack_100;
  pcVar44 = pcVar43;
LAB_00191c3d:
  pmVar24->args = pVVar25;
  pVVar10 = ppVar8->macro_call_stack;
  __ptr = pVVar10->varr;
  if (__ptr != (macro_call_t *)0x0) {
    sVar51 = pVVar10->els_num;
    uVar49 = sVar51 + 1;
    if (pVVar10->size < uVar49) {
      sVar51 = (uVar49 >> 1) + uVar49;
      __ptr = (macro_call_t *)realloc(__ptr,sVar51 * 8);
      pVVar10->varr = __ptr;
      pVVar10->size = sVar51;
      sVar51 = pVVar10->els_num;
      uVar49 = sVar51 + 1;
    }
    pVVar10->els_num = uVar49;
    __ptr[sVar51] = pmVar24;
    return;
  }
LAB_00191ccd:
  try_param_macro_call_cold_8();
LAB_00191cd2:
  try_param_macro_call_cold_3();
LAB_00191cd7:
  try_param_macro_call_cold_15();
LAB_00191cdc:
  try_param_macro_call_cold_13();
LAB_00191ce1:
  try_param_macro_call_cold_12();
LAB_00191ce6:
  try_param_macro_call_cold_11();
LAB_00191ceb:
  try_param_macro_call_cold_10();
LAB_00191cf0:
  try_param_macro_call_cold_7();
LAB_00191cf5:
  try_param_macro_call_cold_4();
LAB_00191cfa:
  try_param_macro_call_cold_5();
  pvVar27 = (void *)pcVar44->env[0].__jmpbuf[0];
  if (pvVar27 != (void *)0x0) {
    pMVar21 = pcVar44->ctx;
    pMVar36 = (MIR_context_t)((long)&pMVar21->gen_ctx + 1);
    if ((MIR_context_t)pcVar44->options < pMVar36) {
      pcVar55 = (c2mir_options *)((long)&pMVar36->gen_ctx + ((ulong)pMVar36 >> 1));
      pvVar27 = realloc(pvVar27,(long)pcVar55 * 8);
      pcVar44->env[0].__jmpbuf[0] = (long)pvVar27;
      pcVar44->options = pcVar55;
      pMVar21 = pcVar44->ctx;
      pMVar36 = (MIR_context_t)((long)&pMVar21->gen_ctx + 1);
    }
    pcVar44->ctx = pMVar36;
    *(c2m_ctx_t *)((long)pvVar27 + (long)pMVar21 * 8) = pcVar42;
    return;
  }
  unget_next_pptoken_cold_1();
  if (((pcVar44 != (c2m_ctx_t)0x0) && (pcVar44->env[0].__jmpbuf[0] != 0)) &&
     (pMVar36 = pcVar44->ctx, pMVar36 != (MIR_context_t)0x0)) {
    return;
  }
  VARR_token_arr_tlast_cold_1();
  *in_R8 = (char *)0x0;
  pcVar43 = pcVar42;
  pcVar20 = pcVar44;
  if (pcVar42 == (c2m_ctx_t)0x0) {
LAB_00192242:
    get_header_name_cold_15();
LAB_00192247:
    get_header_name_cold_13();
LAB_0019224c:
    get_header_name_cold_12();
  }
  else {
    pcVar31 = (c2m_ctx_t)pcVar42->ctx;
    if (pcVar31 != (c2m_ctx_t)0x0) {
      pcVar20 = (c2m_ctx_t)pcVar42->env[0].__jmpbuf[0];
      if (pcVar20 == (c2m_ctx_t)0x0) goto LAB_00192247;
      pcVar41 = (c2m_ctx_t)0x0;
      pcVar53 = pcVar20;
      do {
        pcVar53 = (c2m_ctx_t)&pcVar53->options;
        pcVar43 = (c2m_ctx_t)pcVar20->env[0].__jmpbuf[(long)((long)&pcVar41[-1].gen_ctx + 6)];
        if (*(short *)&pcVar43->ctx != 0x20) {
          if ((*(int *)(pcVar43->env[0].__jmpbuf + 1) != 0x17) ||
             (pcVar47 = (c2m_ctx_t)((long)&pcVar41->ctx + 1), pcVar31 <= pcVar47))
          goto LAB_00191e17;
          pcVar55 = pcVar43->options;
          pptVar29 = (token_t *)pcVar43->env[0].__jmpbuf[0];
          pVar13 = *(pos_t *)&pcVar43->options;
          pcVar20 = (c2m_ctx_t)((long)pcVar41 - (long)pcVar31);
          pcVar52 = (c2m_ctx_t)0xffffffffffffffff;
          goto LAB_00191dfe;
        }
        pcVar41 = (c2m_ctx_t)((long)&pcVar41->ctx + 1);
      } while (pcVar41 != pcVar31);
LAB_00191e1c:
      pptVar29 = (token_t *)pcVar42->env[0].__jmpbuf[0];
      if (pptVar29 != (token_t *)0x0) {
        pcVar53 = (c2m_ctx_t)(ulong)(*(short *)*pptVar29 == 0x20);
        goto LAB_00191e3b;
      }
      goto LAB_0019224c;
    }
LAB_00191e37:
    pcVar31 = (c2m_ctx_t)0x0;
    pcVar53 = (c2m_ctx_t)0x0;
LAB_00191e3b:
    pcVar43 = (c2m_ctx_t)((long)&pcVar31[-1].gen_ctx + 7);
    if (pcVar53 != pcVar43) {
LAB_00191e88:
      error(pcVar44,0x1c1443,format,pMVar36);
      return;
    }
    if ((pcVar53 < pcVar31) &&
       (pptVar29 = (token_t *)pcVar42->env[0].__jmpbuf[0], pptVar29 != (token_t *)0x0)) {
      ptVar22 = pptVar29[(long)pcVar53];
      sVar1 = *(short *)ptVar22;
      if ((sVar1 == 0x102) || (sVar1 == 0x13e)) {
        get_include_fname(pcVar44,ptVar22,in_R8);
        return;
      }
      goto LAB_00191e88;
    }
  }
  get_header_name_cold_14();
LAB_00192256:
  get_header_name_cold_11();
LAB_0019225b:
  get_header_name_cold_10();
LAB_00192260:
  get_header_name_cold_3();
LAB_00192265:
  get_header_name_cold_8();
LAB_0019226a:
  get_header_name_cold_7();
LAB_0019226f:
  get_header_name_cold_6();
LAB_00192274:
  get_header_name_cold_5();
LAB_00192279:
  get_header_name_cold_4();
  plVar33 = (long *)malloc(0x30);
  pcVar45 = &DAT_00000018;
  *plVar33 = (long)pcVar20;
  plVar33[1] = (long)pcVar43;
  plVar33[2] = extraout_RDX;
  *(undefined4 *)(plVar33 + 4) = 0;
  plVar33[3] = 0;
  puVar34 = (undefined8 *)malloc(0x18);
  plVar33[5] = (long)puVar34;
  if (puVar34 == (undefined8 *)0x0) {
    mir_varr_error(pcVar45);
  }
  *puVar34 = 0;
  puVar34[1] = 0x40;
  pvVar27 = malloc(0x200);
  puVar34[2] = pvVar27;
  return;
}

Assistant:

static void pop_macro_call (c2m_ctx_t c2m_ctx) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  macro_call_t mc;

  mc = VARR_POP (macro_call_t, macro_call_stack);
#ifdef C2MIR_PREPRO_DEBUG
  fprintf (stderr, "finish call of macro %s\n", mc->macro->id->repr);
#endif
  mc->macro->ignore_p = FALSE;
  free_macro_call (mc);
}